

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O3

void __thiscall Assimp::XFileExporter::~XFileExporter(XFileExporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  aiScene *this_00;
  pointer pcVar2;
  
  this->_vptr_XFileExporter = (_func_int **)&PTR__XFileExporter_0080c380;
  if (this->mSceneOwned == true) {
    this_00 = this->mScene;
    if (this_00 != (aiScene *)0x0) {
      aiScene::~aiScene(this_00);
    }
    operator_delete(this_00,0x80);
  }
  pcVar2 = (this->endstr)._M_dataplus._M_p;
  paVar1 = &(this->endstr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->startstr)._M_dataplus._M_p;
  paVar1 = &(this->startstr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->mFile)._M_dataplus._M_p;
  paVar1 = &(this->mFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->mPath)._M_dataplus._M_p;
  paVar1 = &(this->mPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->mOutput);
  std::ios_base::~ios_base((ios_base *)&this->field_0x88);
  return;
}

Assistant:

XFileExporter::~XFileExporter()
{
    if(mSceneOwned) {
        delete mScene;
    }
}